

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psist.c
# Opt level: O3

int test_psist_file(void)

{
  int iVar1;
  char *pcVar2;
  QcPsist *qTbl;
  QcMessage *pQVar3;
  QcQueue *queue;
  int iVar4;
  QcErr err;
  char buf [256];
  char descript [512];
  QcErr local_42c;
  char local_328 [256];
  char local_228 [512];
  
  memset(local_328,0,0x100);
  pcVar2 = qc_dir_getcwd(local_328,0x100);
  memset(local_228,0,0x200);
  sprintf(local_228,"file://%s/%s",pcVar2,"mq_test01.tbl");
  qTbl = qc_psist_open(0x400,10000,local_228,&local_42c);
  if (qTbl == (QcPsist *)0x0) {
    pcVar2 = "open psist failed.";
  }
  else {
    iVar4 = 1000;
    do {
      pQVar3 = qc_message_create("hello psist file!",0x11,2);
      iVar1 = qc_psist_append(qTbl,pQVar3,&local_42c);
      if (iVar1 != 0) {
        pcVar2 = "psist append failed.";
        goto LAB_00105e20;
      }
      qc_message_release(pQVar3);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    queue = qc_queue_create(10000,10,(QcErr *)0x0);
    iVar4 = qc_psist_loadqueue(qTbl,queue,&local_42c);
    if (iVar4 == 0) {
      iVar4 = 1000;
      while (pQVar3 = qc_queue_msgget(queue,1,(QcErr *)0x0), pQVar3 != (QcMessage *)0x0) {
        qc_message_release(pQVar3);
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          qc_psist_close(qTbl);
          return 0;
        }
      }
      pcVar2 = "qc_queue_msgget failed.";
    }
    else {
      pcVar2 = "load queue failed.";
    }
  }
LAB_00105e20:
  puts(pcVar2);
  return -1;
}

Assistant:

int test_psist_file()
{
	QcErr err;
	int ret;

	char buf[256];
	memset(buf, 0, sizeof(buf));

	char* cwd = qc_dir_getcwd(buf, sizeof(buf));

	char descript[512];
	memset(descript, 0, sizeof(descript));
	sprintf(descript, "file://%s/%s", cwd, filename);


	QcPsist *qPsist = qc_psist_open(MSG_BUFF_SIZE, MSG_COUNT_LIMIT, descript, &err);
	if (!qPsist) {
		printf("open psist failed.\n");
		return -1;
	}

	for (int i = 0; i < 1000; i++) {
		QcMessage *message = qc_message_create(buff, (int)strlen(buff), BUFFFLAG_NO_FREE);
		ret = qc_psist_append(qPsist, message, &err);
		if (0 != ret) {
			printf("psist append failed.\n");
			return -1;
		}
		qc_message_release(message);
	}

	QcQueue* queue = qc_queue_create(MSG_COUNT_LIMIT, 10, NULL);
	ret = qc_psist_loadqueue(qPsist, queue, &err);
	if (0 != ret) {
		printf("load queue failed.\n");
		return -1;
	}

	for (int i = 0; i < 1000; i++) {
		QcMessage *message1 = qc_queue_msgget(queue, 1, NULL);
		if (NULL == message1) {
			printf("qc_queue_msgget failed.\n");
			return -1;
		}

		//printf("msg:%s\n", qc_message_buff(message1));
		qc_message_release(message1);
	}

	qc_psist_close(qPsist);

	return 0;
}